

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O0

void __thiscall duckdb::ExtensionFunctionInfo::~ExtensionFunctionInfo(ExtensionFunctionInfo *this)

{
  ExtensionFunctionInfo *in_RDI;
  
  ~ExtensionFunctionInfo(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit ExtensionFunctionInfo(string extension_p) : extension(std::move(extension_p)) {
	}